

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O3

void __thiscall
testing::internal::StreamingListener::OnTestStart(StreamingListener *this,TestInfo *test_info)

{
  long *plVar1;
  size_type *psVar2;
  string local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"event=TestStart&name=","");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_40);
  psVar2 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_60.field_2._M_allocated_capacity = *psVar2;
    local_60.field_2._8_8_ = plVar1[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar2;
    local_60._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_60._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  AbstractSocketWriter::SendLn((this->socket_writer_).ptr_,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return;
}

Assistant:

void OnTestStart(const TestInfo& test_info) {
    SendLn(std::string("event=TestStart&name=") + test_info.name());
  }